

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merl.cpp
# Opt level: O0

bool loadTextures(void)

{
  bool bVar1;
  undefined1 local_9;
  bool v;
  
  local_9 = loadSceneFramebufferTexture();
  if (local_9) {
    bVar1 = loadBackFramebufferTexture();
    local_9 = local_9 && bVar1;
  }
  if (local_9 != false) {
    bVar1 = loadEnvmapTexture();
    local_9 = (local_9 & bVar1) != 0;
  }
  if (local_9 != false) {
    bVar1 = loadNpfTexture();
    local_9 = (local_9 & bVar1) != 0;
  }
  if (local_9 != false) {
    bVar1 = loadMerlTexture();
    local_9 = (local_9 & bVar1) != 0;
  }
  return local_9;
}

Assistant:

bool loadTextures()
{
    bool v = true;

    if (v) v&= loadSceneFramebufferTexture();
    if (v) v&= loadBackFramebufferTexture();
    if (v) v&= loadEnvmapTexture();
    if (v) v&= loadNpfTexture();
    if (v) v&= loadMerlTexture();

    return v;
}